

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarymodelserialiser.cpp
# Opt level: O2

bool __thiscall
BinaryModelSerialiserPrivate::writeBinary(BinaryModelSerialiserPrivate *this,QDataStream *writer)

{
  QAbstractItemModel *pQVar1;
  char cVar2;
  int iVar3;
  QDataStream *pQVar4;
  int *piVar5;
  int *piVar6;
  int i;
  int iVar7;
  bool bVar8;
  QVariant roleData;
  QArrayDataPointer<char16_t> local_48;
  
  if ((this->super_AbstractModelSerialiserPrivate).m_constModel == (QAbstractItemModel *)0x0) {
    bVar8 = false;
  }
  else {
    iVar7 = *(int *)(writer + 0x18);
    *(undefined4 *)(writer + 0x18) = 0xd;
    QDataStream::operator<<(writer,iVar7);
    *(int *)(writer + 0x18) = iVar7;
    roleData.d.data.shared = (PrivateShared *)0x0;
    roleData.d.data._8_8_ = anon_var_dwarf_50d84;
    roleData.d.data._16_8_ = 0x24;
    local_48.d = (Data *)0x0;
    local_48.ptr = (char16_t *)0x0;
    local_48.size = 0;
    ::operator<<(writer,(QString *)&roleData);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleData);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    roleData.d.data._forAlignment = -NAN;
    roleData.d.data._8_8_ = 0;
    roleData.d.data._16_8_ = 0;
    writeBinaryElement(this,writer,(QModelIndex *)&roleData);
    iVar7 = 0;
    while( true ) {
      pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_constModel;
      roleData.d.data._forAlignment = -NAN;
      roleData.d.data._8_8_ = 0;
      roleData.d.data._16_8_ = 0;
      iVar3 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,&roleData);
      if (iVar3 <= iVar7) break;
      piVar5 = (this->super_AbstractModelSerialiserPrivate).m_rolesToSave.d.ptr;
      for (piVar6 = piVar5;
          piVar6 != piVar5 + (this->super_AbstractModelSerialiserPrivate).m_rolesToSave.d.size;
          piVar6 = piVar6 + 1) {
        pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_constModel;
        (**(code **)(*(long *)pQVar1 + 0xa0))(&roleData,pQVar1,iVar7,1,*piVar6);
        cVar2 = ::QVariant::isNull();
        if (cVar2 == '\0') {
          pQVar4 = (QDataStream *)QDataStream::operator<<(writer,*piVar6);
          ::operator<<(pQVar4,&roleData);
        }
        ::QVariant::~QVariant(&roleData);
        piVar5 = (this->super_AbstractModelSerialiserPrivate).m_rolesToSave.d.ptr;
      }
      QDataStream::operator<<(writer,-1);
      iVar7 = iVar7 + 1;
    }
    iVar7 = 0;
    while( true ) {
      pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_constModel;
      roleData.d.data._forAlignment = -NAN;
      roleData.d.data._8_8_ = 0;
      roleData.d.data._16_8_ = 0;
      iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&roleData);
      if (iVar3 <= iVar7) break;
      piVar5 = (this->super_AbstractModelSerialiserPrivate).m_rolesToSave.d.ptr;
      for (piVar6 = piVar5;
          piVar6 != piVar5 + (this->super_AbstractModelSerialiserPrivate).m_rolesToSave.d.size;
          piVar6 = piVar6 + 1) {
        pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_constModel;
        (**(code **)(*(long *)pQVar1 + 0xa0))(&roleData,pQVar1,iVar7,2,*piVar6);
        cVar2 = ::QVariant::isNull();
        if (cVar2 == '\0') {
          pQVar4 = (QDataStream *)QDataStream::operator<<(writer,*piVar6);
          ::operator<<(pQVar4,&roleData);
        }
        ::QVariant::~QVariant(&roleData);
        piVar5 = (this->super_AbstractModelSerialiserPrivate).m_rolesToSave.d.ptr;
      }
      QDataStream::operator<<(writer,-1);
      iVar7 = iVar7 + 1;
    }
    iVar7 = QDataStream::status();
    bVar8 = iVar7 == 0;
  }
  return bVar8;
}

Assistant:

bool BinaryModelSerialiserPrivate::writeBinary(QDataStream &writer) const
{
    if (!m_constModel)
        return false;
    const qint32 writerVersion = writer.version();
    writer.setVersion(QDataStream::Qt_5_0);
    writer << writerVersion;
    writer.setVersion(writerVersion);
    writer << Magic_Model_Header;
    writeBinaryElement(writer);
    for (int i = 0; i < m_constModel->columnCount(); ++i) {
        for (QList<int>::const_iterator singleRole = m_rolesToSave.constBegin(); singleRole != m_rolesToSave.constEnd(); ++singleRole) {
            const QVariant roleData = m_constModel->headerData(i, Qt::Horizontal, *singleRole);
            if (roleData.isNull())
                continue;
            writer << static_cast<qint32>(*singleRole) << roleData;
        }
        writer << static_cast<qint32>(-1);
    }
    for (int i = 0; i < m_constModel->rowCount(); ++i) {
        for (QList<int>::const_iterator singleRole = m_rolesToSave.constBegin(); singleRole != m_rolesToSave.constEnd(); ++singleRole) {
            const QVariant roleData = m_constModel->headerData(i, Qt::Vertical, *singleRole);
            if (roleData.isNull())
                continue;
            writer << static_cast<qint32>(*singleRole) << roleData;
        }
        writer << static_cast<qint32>(-1);
    }
    return writer.status() == QDataStream::Ok;
}